

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IexBaseExc.cpp
# Opt level: O0

void __thiscall Iex_3_2::BaseExc::BaseExc(BaseExc *this,stringstream *s)

{
  exception *in_RDI;
  
  std::exception::exception(in_RDI);
  *(undefined ***)in_RDI = &PTR__BaseExc_00188610;
  std::__cxx11::stringstream::str();
  if ((anonymous_namespace)::currentStackTracer_abi_cxx11_ == (code *)0x0) {
    std::__cxx11::string::string((string *)(in_RDI + 0x28));
  }
  else {
    (*(anonymous_namespace)::currentStackTracer_abi_cxx11_)((string *)(in_RDI + 0x28));
  }
  return;
}

Assistant:

BaseExc::BaseExc (std::stringstream& s)
    : _message (s.str ())
    , _stackTrace (currentStackTracer ? currentStackTracer () : std::string ())
{
    // empty
}